

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_Init(void *arkode_mem,int init_type)

{
  long *liw;
  long *lrw;
  int iVar1;
  int *piVar2;
  realtype *prVar3;
  N_Vector *pp_Var4;
  int error_code;
  char *msgfmt;
  long lVar5;
  MRIStepCoupling MRIC;
  size_t sVar6;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_40;
  ARKodeMem local_38;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_Init",&local_38,&local_40);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (init_type != 0) {
    if (init_type == 1) {
      return 0;
    }
LAB_003e6254:
    if ((local_40->linit == (ARKLinsolInitFn)0x0) ||
       (iVar1 = (*local_40->linit)(local_38), iVar1 == 0)) {
      if ((local_40->NLS == (SUNNonlinearSolver)0x0) ||
         (iVar1 = mriStep_NlsInit(local_38), iVar1 == 0)) {
        local_38->call_fullrhs = 1;
        return 0;
      }
      msgfmt = "Unable to initialize SUNNonlinearSolver object";
      iVar1 = -0x1d;
      error_code = -0x1d;
    }
    else {
      msgfmt = "The linear solver\'s init routine failed.";
      iVar1 = -5;
      error_code = -5;
    }
    goto LAB_003e6400;
  }
  if (local_40->implicit_rhs == 0 && local_38->user_efun == 0) {
    local_38->user_efun = 0;
    local_38->efun = arkEwtSetSmallReal;
    local_38->e_data = local_38;
  }
  if (local_38->fixedstep == 0) {
    msgfmt = "Adaptive outer time stepping is not currently supported";
  }
  else {
    iVar1 = mriStep_SetCoupling(local_38);
    if (iVar1 == 0) {
      iVar1 = mriStep_CheckCoupling(local_38);
      if (iVar1 == 0) {
        MRIC = local_40->MRIC;
        piVar2 = local_40->stage_map;
        sVar6 = (size_t)MRIC->stages;
        local_40->stages = MRIC->stages;
        iVar1 = MRIC->p;
        local_40->q = MRIC->q;
        local_40->p = iVar1;
        if (piVar2 == (int *)0x0) {
          lVar5 = local_38->liw;
        }
        else {
          free(piVar2);
          sVar6 = (size_t)local_40->stages;
          lVar5 = local_38->liw - sVar6;
          MRIC = local_40->MRIC;
        }
        piVar2 = (int *)calloc(sVar6,4);
        local_40->stage_map = piVar2;
        local_38->liw = lVar5 + sVar6;
        iVar1 = mriStepCoupling_GetStageMap(MRIC,piVar2,&local_40->nstages_stored);
        if (iVar1 == 0) {
          liw = &local_38->liw;
          if (local_40->stagetypes == (int *)0x0) {
            iVar1 = local_40->stages;
            lVar5 = *liw;
            sVar6 = (size_t)iVar1;
          }
          else {
            free(local_40->stagetypes);
            iVar1 = local_40->stages;
            sVar6 = (size_t)iVar1;
            lVar5 = *liw - sVar6;
          }
          piVar2 = (int *)calloc(sVar6,4);
          local_40->stagetypes = piVar2;
          *liw = lVar5 + sVar6;
          if (0 < iVar1) {
            lVar5 = 0;
            do {
              iVar1 = mriStepCoupling_GetStageType(local_40->MRIC,(int)lVar5);
              local_40->stagetypes[lVar5] = iVar1;
              lVar5 = lVar5 + 1;
              iVar1 = local_40->stages;
            } while (lVar5 < iVar1);
          }
          if (local_40->Ae_row == (realtype *)0x0) {
            lVar5 = local_38->lrw;
            sVar6 = (size_t)iVar1;
          }
          else {
            free(local_40->Ae_row);
            sVar6 = (size_t)local_40->stages;
            lVar5 = local_38->lrw - sVar6;
          }
          prVar3 = (realtype *)calloc(sVar6,8);
          local_40->Ae_row = prVar3;
          lrw = &local_38->lrw;
          lVar5 = lVar5 + sVar6;
          local_38->lrw = lVar5;
          if (local_40->Ai_row != (realtype *)0x0) {
            free(local_40->Ai_row);
            sVar6 = (size_t)local_40->stages;
            lVar5 = *lrw - sVar6;
          }
          prVar3 = (realtype *)calloc(sVar6,8);
          local_40->Ai_row = prVar3;
          *lrw = lVar5 + sVar6;
          if ((local_40->explicit_rhs != 0) &&
             (iVar1 = arkAllocVecArray(local_40->nstages_stored,local_38->ewt,&local_40->Fse,
                                       local_38->lrw1,lrw,local_38->liw1,liw), iVar1 == 0)) {
            return -0x14;
          }
          if (local_40->implicit_rhs == 0) {
LAB_003e65eb:
            if ((local_40->NLS != (SUNNonlinearSolver)0x0) && (local_40->ownNLS != 0)) {
              SUNNonlinSolFree(local_40->NLS);
              local_40->NLS = (SUNNonlinearSolver)0x0;
              local_40->ownNLS = 0;
            }
            local_40->lsolve = (ARKLinsolSolveFn)0x0;
            local_40->lfree = (ARKLinsolFreeFn)0x0;
            local_40->linit = (ARKLinsolInitFn)0x0;
            local_40->lsetup = (ARKLinsolSetupFn)0x0;
            local_40->lmem = (void *)0x0;
          }
          else {
            iVar1 = arkAllocVecArray(local_40->nstages_stored,local_38->ewt,&local_40->Fsi,
                                     local_38->lrw1,lrw,local_38->liw1,liw);
            if (iVar1 == 0) {
              return -0x14;
            }
            if (local_40->implicit_rhs == 0) goto LAB_003e65eb;
            iVar1 = arkAllocVec(local_38,local_38->ewt,&local_40->sdata);
            if (iVar1 == 0) {
              return -0x14;
            }
            iVar1 = arkAllocVec(local_38,local_38->ewt,&local_40->zpred);
            if (iVar1 == 0) {
              return -0x14;
            }
            iVar1 = arkAllocVec(local_38,local_38->ewt,&local_40->zcor);
            if (iVar1 == 0) {
              return -0x14;
            }
          }
          sVar6 = (long)local_40->stages * 2 + 2;
          iVar1 = (int)sVar6;
          local_40->nfusedopvecs = iVar1;
          if (local_40->cvals == (realtype *)0x0) {
            prVar3 = (realtype *)calloc(sVar6,8);
            local_40->cvals = prVar3;
            if (prVar3 == (realtype *)0x0) {
              return -0x14;
            }
            *lrw = *lrw + sVar6;
          }
          if (local_40->Xvecs == (N_Vector *)0x0) {
            pp_Var4 = (N_Vector *)calloc((long)iVar1,8);
            local_40->Xvecs = pp_Var4;
            if (pp_Var4 == (N_Vector *)0x0) {
              return -0x14;
            }
            *liw = *liw + (long)iVar1;
          }
          iVar1 = mriStepInnerStepper_AllocVecs
                            (local_40->stepper,local_40->MRIC->nmat,local_38->ewt);
          if (iVar1 != 0) {
            arkProcessError(local_38,-0x16,"ARKode::MRIStep","mriStep_Init",
                            "Error allocating inner stepper memory");
            return -0x14;
          }
          if ((local_38->interp == (ARKInterp)0x0) ||
             (iVar1 = arkInterpSetDegree(local_38,local_38->interp,1 - local_40->q), iVar1 == 0))
          goto LAB_003e6254;
          msgfmt = "Unable to update interpolation polynomial degree";
          goto LAB_003e63f3;
        }
      }
      msgfmt = "Error in coupling table";
    }
    else {
      msgfmt = "Could not create coupling table";
    }
  }
LAB_003e63f3:
  iVar1 = -0x16;
  error_code = -0x16;
LAB_003e6400:
  arkProcessError(local_38,error_code,"ARKode::MRIStep","mriStep_Init",msgfmt);
  return iVar1;
}

Assistant:

int mriStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval, j;
  booleantype reset_efun;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method and an internal error weight function */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit_rhs )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )  reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* assume fixed outer step size */
    if (!ark_mem->fixedstep) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Adaptive outer time stepping is not currently supported");
      return(ARK_ILL_INPUT);
    }

    /* Create coupling structure (if not already set) */
    retval = mriStep_SetCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Could not create coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Check that coupling structure is OK */
    retval = mriStep_CheckCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    step_mem->stages = step_mem->MRIC->stages;
    step_mem->q = step_mem->MRIC->q;
    step_mem->p = step_mem->MRIC->p;

    /* allocate/fill derived quantities from MRIC structure */

    /* stage map */
    if (step_mem->stage_map) {
      free(step_mem->stage_map);
      step_mem->stage_map = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stage_map = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;

    retval = mriStepCoupling_GetStageMap(step_mem->MRIC,
                                         step_mem->stage_map,
                                         &(step_mem->nstages_stored));
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* stage types */
    if (step_mem->stagetypes) {
      free(step_mem->stagetypes);
      step_mem->stagetypes = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stagetypes = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;
    for (j=0; j<step_mem->stages; j++)
      step_mem->stagetypes[j] = mriStepCoupling_GetStageType(step_mem->MRIC, j);

    /* explicit RK coefficient row */
    if (step_mem->Ae_row) {
      free(step_mem->Ae_row);
      step_mem->Ae_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ae_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* implicit RK coefficient row */
    if (step_mem->Ai_row) {
      free(step_mem->Ai_row);
      step_mem->Ai_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ai_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* Allocate MRI RHS vector memory, update storage requirements */
    /*   Allocate Fse[0] ... Fse[nstages_stored - 1] if needed */
    if (step_mem->explicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fse),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /*   Allocate Fsi[0] ... Fsi[nstages_stored - 1] if needed */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fsi),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /* if any slow stage is implicit, allocate sdata, zpred, zcor vectors;
       if all stages explicit, free default NLS object, and detach all
       linear solver routines.  Note: step_mem->implicit_rhs will only equal
       SUNTRUE if an implicit table has been user-provided. */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->sdata)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zpred)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zcor)))
        return(ARK_MEM_FAIL);
    } else {
      if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {
        SUNNonlinSolFree(step_mem->NLS);
        step_mem->NLS = NULL;
        step_mem->ownNLS = SUNFALSE;
      }
      step_mem->linit  = NULL;
      step_mem->lsetup = NULL;
      step_mem->lsolve = NULL;
      step_mem->lfree  = NULL;
      step_mem->lmem   = NULL;
    }

    /* Allocate reusable arrays for fused vector interface */
    step_mem->nfusedopvecs = 2*step_mem->stages + 2;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs, sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += (step_mem->nfusedopvecs);   /* pointers */
    }

    /* Allocate inner stepper data */
    retval = mriStepInnerStepper_AllocVecs(step_mem->stepper,
                                           step_mem->MRIC->nmat, ark_mem->ewt);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Error allocating inner stepper memory");
      return(ARK_MEM_FAIL);
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = mriStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  /* Signal to shared arkode module that fullrhs is required after each step */
  ark_mem->call_fullrhs = SUNTRUE;

  return(ARK_SUCCESS);
}